

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O3

void __thiscall jrtplib::RTPUDPv6Transmitter::AddLoopbackAddress(RTPUDPv6Transmitter *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  undefined1 auVar4 [16];
  
  p_Var2 = (_List_node_base *)&this->localIPs;
  do {
    p_Var2 = (((_List_base<in6_addr,_std::allocator<in6_addr>_> *)&p_Var2->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)&this->localIPs) {
      p_Var3 = (_List_node_base *)operator_new(0x20);
      p_Var2 = (_List_node_base *)
               CONCAT17(cRam00000000001460ff,
                        CONCAT16(cRam00000000001460fe,
                                 CONCAT15(cRam00000000001460fd,
                                          CONCAT14(cRam00000000001460fc,
                                                   CONCAT13(cRam00000000001460fb,
                                                            CONCAT12(cRam00000000001460fa,
                                                                     CONCAT11(cRam00000000001460f9,
                                                                              std::
                                                  __throw_bad_array_new_length)))))));
      p_Var3[1]._M_next =
           (_List_node_base *)
           CONCAT17(cRam00000000001460f7,
                    CONCAT16(cRam00000000001460f6,
                             CONCAT15(cRam00000000001460f5,
                                      CONCAT14(cRam00000000001460f4,
                                               CONCAT13(cRam00000000001460f3,
                                                        CONCAT12(cRam00000000001460f2,
                                                                 CONCAT11(cRam00000000001460f1,
                                                                          in6addr_loopback)))))));
      p_Var3[1]._M_prev = p_Var2;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      psVar1 = &(this->localIPs).super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      return;
    }
    auVar4[0] = -(in6addr_loopback == *(char *)&p_Var2[1]._M_next);
    auVar4[1] = -(cRam00000000001460f1 == *(undefined1 *)((long)&p_Var2[1]._M_next + 1));
    auVar4[2] = -(cRam00000000001460f2 == *(undefined1 *)((long)&p_Var2[1]._M_next + 2));
    auVar4[3] = -(cRam00000000001460f3 == *(undefined1 *)((long)&p_Var2[1]._M_next + 3));
    auVar4[4] = -(cRam00000000001460f4 == *(undefined1 *)((long)&p_Var2[1]._M_next + 4));
    auVar4[5] = -(cRam00000000001460f5 == *(undefined1 *)((long)&p_Var2[1]._M_next + 5));
    auVar4[6] = -(cRam00000000001460f6 == *(undefined1 *)((long)&p_Var2[1]._M_next + 6));
    auVar4[7] = -(cRam00000000001460f7 == *(undefined1 *)((long)&p_Var2[1]._M_next + 7));
    auVar4[8] = -(std::__throw_bad_array_new_length == *(code *)&p_Var2[1]._M_prev);
    auVar4[9] = -(cRam00000000001460f9 == *(undefined1 *)((long)&p_Var2[1]._M_prev + 1));
    auVar4[10] = -(cRam00000000001460fa == *(undefined1 *)((long)&p_Var2[1]._M_prev + 2));
    auVar4[0xb] = -(cRam00000000001460fb == *(undefined1 *)((long)&p_Var2[1]._M_prev + 3));
    auVar4[0xc] = -(cRam00000000001460fc == *(undefined1 *)((long)&p_Var2[1]._M_prev + 4));
    auVar4[0xd] = -(cRam00000000001460fd == *(undefined1 *)((long)&p_Var2[1]._M_prev + 5));
    auVar4[0xe] = -(cRam00000000001460fe == *(undefined1 *)((long)&p_Var2[1]._M_prev + 6));
    auVar4[0xf] = -(cRam00000000001460ff == *(undefined1 *)((long)&p_Var2[1]._M_prev + 7));
  } while ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar4[0xf] >> 7) << 0xf) != 0xffff);
  return;
}

Assistant:

void RTPUDPv6Transmitter::AddLoopbackAddress()
{
	std::list<in6_addr>::const_iterator it;
	bool found = false;

	for (it = localIPs.begin() ; !found && it != localIPs.end() ; it++)
	{
		if ((*it) == in6addr_loopback)
			found = true;
	}

	if (!found)
		localIPs.push_back(in6addr_loopback);
}